

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O0

Graph create_graph(void)

{
  istream *piVar1;
  ostream *this;
  int local_2c;
  char local_25;
  int i_1;
  char c;
  Graph p_Stack_20;
  int i;
  Graph graph;
  int local_10;
  int end;
  int start;
  int length;
  
  p_Stack_20 = (Graph)malloc(0x7a1230);
  for (i_1 = 0; i_1 < 0xf4245; i_1 = i_1 + 1) {
    p_Stack_20->head[i_1] = (adjacentNode)0x0;
  }
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)p_Stack_20);
  std::istream::operator>>(piVar1,&p_Stack_20->edge_num);
  for (local_2c = 0; local_2c < p_Stack_20->edge_num; local_2c = local_2c + 1) {
    piVar1 = std::operator>>((istream *)&std::cin,&local_25);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_10);
    piVar1 = (istream *)std::istream::operator>>(piVar1,(int *)((long)&graph + 4));
    std::istream::operator>>(piVar1,&end);
    add_edge(p_Stack_20,local_10,graph._4_4_,end);
    if (local_2c % 200 == 0) {
      this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
  }
  return p_Stack_20;
}

Assistant:

Graph create_graph() {
    int length, start, end;
//    alloc the space gor graph
    Graph graph = (Graph) malloc(sizeof(struct _graph));
//    init the matrix
    for (int i = 0; i < MAX; ++i) {
        graph->head[i] = nullptr;
    }
//    read the numbers
    char c;
    cin >> graph->vertex_num >> graph->edge_num;
//    read each lines
    for (int i = 0; i < graph->edge_num; i++) {
        cin >> c >> start >> end >> length;
        add_edge(graph, start, end, length);
        if (i % 200 == 0) {
            cout << i << endl;
        }
    }
    return graph;
}